

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_scriptpubkey_csv_2of2_then_1_from_bytes_opt
              (uchar *bytes,size_t bytes_len,uint32_t csv_blocks,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  
  if (csv_blocks == 0) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    uVar4 = (ulong)csv_blocks;
    do {
      uVar8 = uVar4;
      lVar6 = lVar6 + 1;
      uVar4 = uVar8 >> 8;
    } while (0xff < uVar8);
    lVar6 = (ulong)(0x7f < uVar8) + lVar6;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar5 = -2;
  if (((bytes_out != (uchar *)0x0 && flags == 0) &&
      (csv_blocks - 0x11 < 0xffef && (bytes_len == 0x42 && bytes != (uchar *)0x0))) &&
      written != (size_t *)0x0) {
    if (lVar6 + 0x4bU <= len) {
      *bytes_out = '!';
      uVar1 = *(undefined8 *)(bytes + 0x29);
      uVar2 = *(undefined8 *)(bytes + 0x31);
      uVar3 = *(undefined8 *)(bytes + 0x39);
      *(undefined8 *)(bytes_out + 1) = *(undefined8 *)(bytes + 0x21);
      *(undefined8 *)(bytes_out + 9) = uVar1;
      *(undefined8 *)(bytes_out + 0x11) = uVar2;
      *(undefined8 *)(bytes_out + 0x19) = uVar3;
      bytes_out[0x21] = bytes[0x41];
      bytes_out[0x22] = 0xad;
      bytes_out[0x23] = '!';
      uVar1 = *(undefined8 *)(bytes + 8);
      uVar2 = *(undefined8 *)(bytes + 0x10);
      uVar3 = *(undefined8 *)(bytes + 0x18);
      *(undefined8 *)(bytes_out + 0x24) = *(undefined8 *)bytes;
      *(undefined8 *)(bytes_out + 0x2c) = uVar1;
      *(undefined8 *)(bytes_out + 0x34) = uVar2;
      *(undefined8 *)(bytes_out + 0x3c) = uVar3;
      bytes_out[0x44] = bytes[0x20];
      bytes_out[0x45] = 0xac;
      bytes_out[0x46] = 's';
      bytes_out[0x47] = 'd';
      bytes_out[0x48] = (uchar)lVar6;
      sVar7 = scriptint_to_bytes((ulong)csv_blocks,bytes_out + 0x49);
      (bytes_out + sVar7 + 0x49)[0] = 0xb2;
      (bytes_out + sVar7 + 0x49)[1] = 'h';
    }
    *written = lVar6 + 0x4bU;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int wally_scriptpubkey_csv_2of2_then_1_from_bytes_opt(
    const unsigned char *bytes, size_t bytes_len, uint32_t csv_blocks,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t csv_len = scriptint_get_length(csv_blocks);
    size_t script_len = 2 * (EC_PUBLIC_KEY_LEN + 1) + 6 + 1 + csv_len; /* 1 for push */

    if (written)
        *written = 0;

    if (!bytes || bytes_len != 2 * EC_PUBLIC_KEY_LEN ||
        csv_blocks < 17 || csv_blocks > 0xffff || flags || !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    /* The script we create is:
     *     <recovery_pubkey> OP_CHECKSIGVERIFY
     *     <main_pubkey> OP_CHECKSIG OP_IFDUP OP_NOTIF
     *         <CSV_BLOCK> OP_CHECKSEQUENCEVERIFY
     * OP_ENDIF
     * Solved by:
     * 1) The stack containing the main and and recovery signatures.
     * 2) The stack containing an empty signature and the recovery signature.
     */
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes + EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_CHECKSIGVERIFY;
    *bytes_out++ = EC_PUBLIC_KEY_LEN;
    memcpy(bytes_out, bytes, EC_PUBLIC_KEY_LEN);
    bytes_out += EC_PUBLIC_KEY_LEN;
    *bytes_out++ = OP_CHECKSIG;
    *bytes_out++ = OP_IFDUP;
    *bytes_out++ = OP_NOTIF;
    *bytes_out++ = csv_len & 0xff;
    bytes_out += scriptint_to_bytes(csv_blocks, bytes_out);
    *bytes_out++ = OP_CHECKSEQUENCEVERIFY;
    *bytes_out++ = OP_ENDIF;

    *written = script_len;
    return WALLY_OK;
}